

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O2

size_t __thiscall adios2::transport::FileStdio::GetSize(FileStdio *this)

{
  long __off;
  size_t sVar1;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  WaitForOpen(this);
  __off = ftell((FILE *)this->m_File);
  if (__off == -1) {
    std::__cxx11::string::string((string *)&local_38,"Toolkit",&local_b9);
    std::__cxx11::string::string((string *)&local_58,"transport::file::FileStdio",&local_ba);
    std::__cxx11::string::string((string *)&local_78,"GetSize",&local_bb);
    std::operator+(&local_b8,"couldn\'t get current position of ",&(this->super_Transport).m_Name);
    std::operator+(&local_98,&local_b8," file, in call to FileStdio GetSize ftell");
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  fseek((FILE *)this->m_File,0,2);
  sVar1 = ftell((FILE *)this->m_File);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)&local_38,"Toolkit",&local_b9);
    std::__cxx11::string::string((string *)&local_58,"transport::file::FileStdio",&local_ba);
    std::__cxx11::string::string((string *)&local_78,"GetSize",&local_bb);
    std::operator+(&local_b8,"couldn\'t get size of ",&(this->super_Transport).m_Name);
    std::operator+(&local_98,&local_b8," file, in call to FileStdio GetSize ftell");
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  fseek((FILE *)this->m_File,__off,0);
  return sVar1;
}

Assistant:

size_t FileStdio::GetSize()
{
    WaitForOpen();
    const auto currentPosition = ftell(m_File);
    if (currentPosition == -1L)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "GetSize",
                                              "couldn't get current position of " + m_Name +
                                                  " file, in call to FileStdio GetSize ftell");
    }

    fseek(m_File, 0, SEEK_END);
    const auto size = ftell(m_File);
    if (size == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "GetSize",
                                              "couldn't get size of " + m_Name +
                                                  " file, in call to FileStdio GetSize ftell");
    }
    fseek(m_File, currentPosition, SEEK_SET);
    return static_cast<size_t>(size);
}